

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode ExtensionObject_decodeBinary(UA_ExtensionObject *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_DataType *pUVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  void *pvVar5;
  UA_Byte UVar6;
  ulong uVar7;
  uint uVar8;
  UA_DataType *local_40;
  undefined8 uStack_38;
  UA_NodeId typeId;
  
  uStack_38 = (UA_DataType *)0x0;
  typeId.namespaceIndex = 0;
  typeId._2_2_ = 0;
  typeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  typeId.identifier.string.length = 0;
  UVar3 = NodeId_decodeBinary((UA_NodeId *)&uStack_38,_);
  uVar8 = 0;
  if (end < pos + 1) {
    UVar6 = '\0';
    uVar8 = 0x80070000;
  }
  else {
    UVar6 = *pos;
    pos = pos + 1;
  }
  pUVar1 = pos;
  UVar4 = 0x80070000;
  if (uStack_38._4_4_ == UA_NODEIDTYPE_NUMERIC) {
    UVar4 = uVar8 | UVar3;
  }
  if (UVar4 == 0) {
    if (UVar6 == '\0') {
      dst->encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
      (dst->content).decoded.type = uStack_38;
      (dst->content).decoded.data = (void *)typeId._0_8_;
      *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
      (dst->content).encoded.body.length = 0;
      (dst->content).encoded.body.data = (UA_Byte *)0x0;
      UVar4 = 0;
    }
    else {
      if (UVar6 == '\x02') {
        dst->encoding = UA_EXTENSIONOBJECT_ENCODED_XML;
        (dst->content).decoded.type = uStack_38;
        (dst->content).decoded.data = (void *)typeId._0_8_;
        *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
        UVar3 = ByteString_decodeBinary(&(dst->content).encoded.body);
        return UVar3;
      }
      UVar4 = 0x80070000;
      if (UVar6 == '\x01') {
        local_40 = (UA_DataType *)0x0;
        findDataTypeByBinary((UA_NodeId *)&uStack_38,&local_40);
        pUVar2 = local_40;
        if (local_40 == (UA_DataType *)0x0) {
          dst->encoding = UA_EXTENSIONOBJECT_ENCODED_BYTESTRING;
          (dst->content).decoded.type = uStack_38;
          (dst->content).decoded.data = (void *)typeId._0_8_;
          *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
          UVar4 = ByteString_decodeBinary(&(dst->content).encoded.body);
        }
        else {
          pvVar5 = UA_new(local_40);
          (dst->content).decoded.data = pvVar5;
          if (pvVar5 == (void *)0x0) {
            UVar4 = 0x80030000;
          }
          else {
            pos = pUVar1 + 4;
            dst->encoding = UA_EXTENSIONOBJECT_DECODED;
            (dst->content).decoded.type = pUVar2;
            if ((pUVar2->field_0x25 & 1) == 0) {
              uVar7 = 0x19;
            }
            else {
              uVar7 = (ulong)pUVar2->typeIndex;
            }
            UVar4 = (*(code *)(&decodeBinaryJumpTable)[uVar7])(pvVar5,pUVar2);
          }
        }
      }
    }
  }
  else {
    UA_NodeId_deleteMembers((UA_NodeId *)&uStack_38);
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
ExtensionObject_decodeBinary(UA_ExtensionObject *dst, const UA_DataType *_) {
    UA_Byte encoding = 0;
    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    UA_StatusCode retval = NodeId_decodeBinary(&typeId, NULL);
    retval |= Byte_decodeBinary(&encoding, NULL);
    if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        retval = UA_STATUSCODE_BADDECODINGERROR;
    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeId_deleteMembers(&typeId);
        return retval;
    }

    if(encoding == UA_EXTENSIONOBJECT_ENCODED_BYTESTRING) {
        retval = ExtensionObject_decodeBinaryContent(dst, &typeId);
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        dst->content.encoded.body = UA_BYTESTRING_NULL;
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_XML) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        retval = ByteString_decodeBinary(&dst->content.encoded.body);
    } else {
        retval = UA_STATUSCODE_BADDECODINGERROR;
    }
    return retval;
}